

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

int64_t __thiscall mocker::ir::Interpreter::run(Interpreter *this)

{
  pointer pGVar1;
  pointer pcVar2;
  void *__dest;
  mapped_type *pmVar3;
  int64_t iVar4;
  vector<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_> *__range2;
  GlobalVar *var;
  pointer __k;
  allocator<char> local_69;
  _Vector_base<long,_std::allocator<long>_> local_68;
  string local_48;
  
  pGVar1 = (this->globalVars).
           super__Vector_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (__k = (this->globalVars).
             super__Vector_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
             _M_impl.super__Vector_impl_data._M_start; __k != pGVar1; __k = __k + 1) {
    __dest = fastMalloc(this,(__k->data)._M_string_length);
    memcpy(__dest,(__k->data)._M_dataplus._M_p,(__k->data)._M_string_length);
    pcVar2 = (__k->data)._M_dataplus._M_p;
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->globalReg,&__k->label);
    *pmVar3 = (mapped_type)pcVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"main",&local_69);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = executeFunc(this,&local_48,(vector<long,_std::allocator<long>_> *)&local_68);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return iVar4;
}

Assistant:

std::int64_t Interpreter::run() {
  for (auto &var : globalVars) {
    auto &ident = var.getLabel();
    auto &data = var.getData();
    auto res = fastMalloc(data.size());
    std::memcpy(res, data.c_str(), data.size());
    globalReg[ident] = (std::int64_t)(data.c_str());
  }

  return executeFunc("main", {});
}